

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MicroString::SetFromOtherSlow
          (MicroString *this,MicroString *other,Arena *arena,size_t inline_capacity)

{
  LargeRepKind LVar1;
  string_view data;
  
  if (((ulong)other->rep_ & 1) != 0) {
    LVar1 = large_rep_kind(other);
    if (LVar1 == kUnowned) {
      if ((arena == (Arena *)0x0) && (((ulong)this->rep_ & 3) != 0)) {
        DestroySlow(this);
      }
      this->rep_ = other->rep_;
      return;
    }
  }
  data = Get(other);
  SetImpl(this,data,arena,inline_capacity);
  return;
}

Assistant:

void MicroString::SetFromOtherSlow(const MicroString& other, Arena* arena,
                                   size_t inline_capacity) {
  // Unowned property gets propagated, even if we have a rep already.
  if (other.is_large_rep() && other.large_rep_kind() == kUnowned) {
    if (arena == nullptr) Destroy();
    rep_ = other.rep_;
    return;
  }
  SetImpl(other.Get(), arena, inline_capacity);
}